

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O1

int CVmObjString::find_common<_1>(vm_val_t *retval,vm_val_t *self_val,char *str,uint *argc)

{
  vm_val_t *this;
  ushort uVar1;
  uint uVar2;
  bool bVar3;
  bool bVar4;
  vm_val_t *pvVar5;
  int iVar6;
  int iVar7;
  char *pcVar8;
  byte *pbVar9;
  byte *pbVar10;
  CVmObjPattern *pat;
  byte *len;
  uint uVar11;
  byte *basestr;
  int iVar12;
  int match_idx;
  char *local_48;
  vm_val_t *local_40;
  int match_len;
  
  if (argc == (uint *)0x0) {
    uVar11 = 0;
  }
  else {
    uVar11 = *argc;
  }
  if (find_common<-1>(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc == '\0') {
    find_common<_1>();
  }
  iVar6 = CVmObject::get_prop_check_argc(retval,argc,&find_common<-1>::desc);
  pvVar5 = sp_;
  if (iVar6 != 0) {
    return 1;
  }
  uVar1 = *(ushort *)str;
  len = (byte *)(ulong)uVar1;
  this = sp_ + -1;
  local_40 = self_val;
  pcVar8 = vm_val_t::get_as_string(this);
  if (pcVar8 == (char *)0x0) {
    local_48 = pcVar8;
    if ((this->typ != VM_OBJ) ||
       (uVar2 = pvVar5[-1].val.obj,
       iVar6 = (**(code **)(*(long *)&G_obj_table_X.pages_[uVar2 >> 0xc][uVar2 & 0xfff].ptr_ + 8))
                         (G_obj_table_X.pages_[uVar2 >> 0xc] + (uVar2 & 0xfff),
                          CVmObjPattern::metaclass_reg_), iVar6 == 0)) {
      err_throw(0x900);
    }
    uVar2 = pvVar5[-1].val.obj;
    pat = (CVmObjPattern *)
          ((long)&G_obj_table_X.pages_[uVar2 >> 0xc]->ptr_ + (ulong)((uVar2 & 0xfff) * 0x18));
    pcVar8 = local_48;
  }
  else {
    pat = (CVmObjPattern *)0x0;
  }
  basestr = (byte *)(str + 2);
  if ((uVar11 < 2) || (sp_[-2].typ == VM_NIL)) {
    pbVar10 = basestr + (long)len;
    if (len == (byte *)0x0) {
      len = (byte *)0x0;
      iVar6 = 0;
    }
    else {
      len = (byte *)0x0;
      iVar6 = 0;
      pbVar9 = basestr;
      do {
        pbVar9 = pbVar9 + (ulong)(((*pbVar9 >> 5 & 1) != 0) + 1 & (uint)(*pbVar9 >> 7) * 3) + 1;
        iVar6 = iVar6 + 1;
      } while (pbVar9 < pbVar10);
    }
  }
  else {
    if (sp_[-2].typ == VM_INT) {
      iVar7 = sp_[-2].val.intval;
    }
    else {
      iVar7 = vm_val_t::nonint_num_to_int(sp_ + -2);
    }
    if (iVar7 == 0) {
      if (len == (byte *)0x0) {
LAB_002c1d23:
        iVar12 = 0;
      }
      else {
        iVar12 = 0;
        pbVar10 = basestr;
        do {
          pbVar10 = pbVar10 + (ulong)(((*pbVar10 >> 5 & 1) != 0) + 1 & (uint)(*pbVar10 >> 7) * 3) +
                              1;
          iVar12 = iVar12 + 1;
        } while (pbVar10 < basestr + (long)len);
      }
    }
    else {
      iVar12 = -1;
      if (iVar7 < 0) {
        if (len == (byte *)0x0) goto LAB_002c1d23;
        iVar12 = 0;
        pbVar10 = basestr;
        do {
          pbVar10 = pbVar10 + (ulong)(((*pbVar10 >> 5 & 1) != 0) + 1 & (uint)(*pbVar10 >> 7) * 3) +
                              1;
          iVar12 = iVar12 + 1;
        } while (pbVar10 < basestr + (long)len);
      }
    }
    iVar6 = iVar12 + iVar7;
    bVar3 = SCARRY4(iVar12,iVar7) == iVar6 < 0;
    bVar4 = iVar6 != 0 && bVar3;
    pbVar10 = basestr;
    if (uVar1 != 0 && (iVar6 != 0 && bVar3)) {
      iVar7 = 1;
      pbVar9 = basestr;
      do {
        pbVar10 = pbVar9 + (ulong)(((*pbVar9 >> 5 & 1) != 0) + 1 & (uint)(*pbVar9 >> 7) * 3) + 1;
        len = pbVar9 + ((long)len - (long)pbVar10);
        bVar4 = iVar7 < iVar6;
        if (iVar6 <= iVar7) break;
        iVar7 = iVar7 + 1;
        pbVar9 = pbVar10;
      } while (len != (byte *)0x0);
    }
    iVar7 = 0;
    if (bVar4) {
      retval->typ = VM_NIL;
      iVar7 = 5;
      pbVar10 = basestr;
    }
    if (iVar7 != 0) {
      if (iVar7 != 5) {
        return 1;
      }
      goto LAB_002c1ddc;
    }
  }
  pcVar8 = find_last_substr(local_40,(char *)basestr,(char *)pbVar10,(size_t)len,pcVar8,pat,
                            &match_idx,&match_len);
  if (pcVar8 == (char *)0x0) {
    retval->typ = VM_NIL;
  }
  else {
    retval->typ = VM_INT;
    (retval->val).obj = match_idx + iVar6 + 1;
  }
LAB_002c1ddc:
  sp_ = sp_ + -(long)(int)uVar11;
  return 1;
}

Assistant:

inline int CVmObjString::find_common(
    VMG_ vm_val_t *retval,
    const vm_val_t *self_val, const char *str,
    uint *argc)
{
    /* check arguments */
    uint orig_argc = (argc != 0 ? *argc : 0);
    static CVmNativeCodeDesc desc(1, 1);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get the string length and buffer pointer */
    size_t len = vmb_get_len(str);
    str += VMB_LEN;

    /* remember where the base string strings */
    const char *basestr = str;

    /* retrieve the string or regex pattern to find */
    vm_val_t *val2 = G_stk->get(0);
    const char *str2 = val2->get_as_string(vmg0_);
    CVmObjPattern *pat2 = 0;
    if (str2 != 0)
    {
        /* we have a simple string to find */
    }
    else if (val2->typ == VM_OBJ
             && CVmObjPattern::is_pattern_obj(vmg_ val2->val.obj))
    {
        /* it's a pattern */
        pat2 = (CVmObjPattern *)vm_objp(vmg_ val2->val.obj);
    }
    else
    {
        /* we need a string or a pattern; other values are invalid */
        err_throw(VMERR_BAD_TYPE_BIF);
    }

    /* if there's a starting index, skip that many characters */
    int32_t start_idx = 0;
    if (orig_argc >= 2 && G_stk->get(1)->typ != VM_NIL)
    {
        /* get the starting index value */
        start_idx = G_stk->get(1)->num_to_int(vmg0_);

        /* set up a UTF-8 pointer for traversing the string */
        utf8_ptr strp((char *)str);

        /*
         *   A positive index value is a 1-based index from the start of the
         *   string.  A negative index is from the end of the string, with -1
         *   pointing to the last character.  For reverse searches, 0 is the
         *   position past the last character.  In any case, adjust to a
         *   zero-based index.
         */
        start_idx += (start_idx == 0 && dir < 0 ? (int)strp.len(len) :
                      start_idx < 0 ? (int)strp.len(len) :
                      -1);

        /* if there's a substring, we can limit the skip */
        size_t min_len = (dir > 0 && str2 != 0 ? vmb_get_len(str2) : 0);

        /* skip that many characters */
        int32_t i;
        for (i = 0 ; i < start_idx && len > min_len ; ++i, strp.inc(&len)) ;

        /* 
         *   if the start index was past the end of the string (or past the
         *   point where the remaining subject string is too short for the
         *   target string), we definitely can't match 
         */
        if (i < start_idx)
        {
            retval->set_nil();
            goto done;
        }

        /* start the search here */
        str = strp.getptr();
    }
    else if (dir < 0)
    {
        /* 
         *   we're searching backwards, and there's no starting index, so the
         *   starting point is the end of the string 
         */
        str = str + len;
        start_idx = utf8_ptr::s_len(basestr, len);
        len = 0;
    }

    /* find the substring */
    int match_idx, match_len;
    if (dir > 0
        ? find_substr(vmg_ self_val, basestr, str, len, str2, pat2,
                      &match_idx, &match_len) != 0
        : find_last_substr(vmg_ self_val, basestr, str, len, str2, pat2,
                           &match_idx, &match_len) != 0)
    {
        /* found it - adjust to a 1-based value for return */
        retval->set_int(start_idx + match_idx + 1);
    }
    else
    {
        /* didn't find it - return nil */
        retval->set_nil();
    }

done:
    /* discard arguments */
    G_stk->discard(orig_argc);

    /* handled */
    return TRUE;
}